

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int read_operands_table(Dwarf_Macro_Context macro_context,Dwarf_Small *macro_header,
                       Dwarf_Small *macro_data,Dwarf_Small *section_base,Dwarf_Unsigned section_size
                       ,Dwarf_Unsigned *table_size_out,Dwarf_Error *error)

{
  int iVar1;
  void *pvVar2;
  ushort local_de;
  Dwarf_Half k;
  ulong uStack_d8;
  int lu_res_1;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen_1;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Small _ltmp_1;
  ulong uStack_b8;
  int res;
  Dwarf_Unsigned formcount_1;
  Dwarf_Small opcode_number;
  Dwarf_Unsigned DStack_a8;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned formcount;
  Dwarf_Byte_Ptr readend;
  Dwarf_Small *pDStack_80;
  Dwarf_Small _ltmp;
  Dwarf_Byte_Ptr endptr;
  Dwarf_Byte_Ptr startptr;
  Dwarf_Debug dbg;
  Dwarf_Macro_Forms_s *curformentry;
  uint i;
  Dwarf_Small operand_table_count;
  Dwarf_Unsigned cur_offset;
  Dwarf_Unsigned local_size;
  Dwarf_Small *table_data_start;
  Dwarf_Unsigned *table_size_out_local;
  Dwarf_Unsigned section_size_local;
  Dwarf_Small *section_base_local;
  Dwarf_Small *macro_data_local;
  Dwarf_Small *macro_header_local;
  Dwarf_Macro_Context macro_context_local;
  
  cur_offset = 0;
  _i = (Dwarf_Unsigned *)0x0;
  curformentry._7_1_ = 0;
  curformentry._0_4_ = 0;
  dbg = (Dwarf_Debug)0x0;
  startptr = (Dwarf_Byte_Ptr)0x0;
  endptr = (Dwarf_Byte_Ptr)0x0;
  pDStack_80 = (Dwarf_Small *)0x0;
  local_size = (Dwarf_Unsigned)macro_data;
  table_data_start = (Dwarf_Small *)table_size_out;
  table_size_out_local = (Dwarf_Unsigned *)section_size;
  section_size_local = (Dwarf_Unsigned)section_base;
  section_base_local = macro_data;
  macro_data_local = macro_header;
  macro_header_local = (Dwarf_Small *)macro_context;
  if ((macro_context == (Dwarf_Macro_Context)0x0) || (macro_context->mc_sentinel != 0xada)) {
    if (macro_context != (Dwarf_Macro_Context)0x0) {
      startptr = (Dwarf_Byte_Ptr)macro_context->mc_dbg;
    }
    _dwarf_error_string((Dwarf_Debug)startptr,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    macro_context_local._4_4_ = 1;
  }
  else {
    startptr = (Dwarf_Byte_Ptr)macro_context->mc_dbg;
    _i = (Dwarf_Unsigned *)(macro_data + (1 - (long)macro_header));
    if (_i < section_size) {
      endptr = macro_context->mc_macro_header;
      pDStack_80 = endptr + macro_context->mc_total_length;
      readend._7_1_ = 0;
      formcount = (Dwarf_Unsigned)(macro_data + 1);
      if (formcount < macro_data) {
        _dwarf_error_string((Dwarf_Debug)startptr,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        macro_context_local._4_4_ = 1;
      }
      else if (pDStack_80 < formcount) {
        _dwarf_error_string((Dwarf_Debug)startptr,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        macro_context_local._4_4_ = 1;
      }
      else {
        (*((Dwarf_Debug)startptr)->de_copy_word)((void *)((long)&readend + 7),macro_data,1);
        curformentry._7_1_ = readend._7_1_;
        section_base_local = section_base_local + 1;
        cur_offset = (Dwarf_Unsigned)(int)((uint)readend._7_1_ << 2);
        _i = (Dwarf_Unsigned *)(section_base_local + (cur_offset - section_size_local));
        if (_i < table_size_out_local) {
          local_size = (Dwarf_Unsigned)section_base_local;
          for (curformentry._0_4_ = 0; (uint)curformentry < curformentry._7_1_;
              curformentry._0_4_ = (uint)curformentry + 1) {
            lu_leblen = 0;
            section_base_local = section_base_local + 1;
            lu_local = 0;
            DStack_a8 = 0;
            formcount_1._4_4_ = 0;
            formcount_1._4_4_ =
                 dwarf_decode_leb128((char *)section_base_local,&lu_local,&stack0xffffffffffffff58,
                                     (char *)pDStack_80);
            if (formcount_1._4_4_ == 1) {
              _dwarf_error_string((Dwarf_Debug)startptr,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
              return 1;
            }
            lu_leblen = DStack_a8;
            section_base_local = section_base_local + lu_local;
            _i = (Dwarf_Unsigned *)(section_base_local + (DStack_a8 - section_size_local));
            if (table_size_out_local <= _i) {
              _dwarf_error((Dwarf_Debug)startptr,error,0x13e);
              return 1;
            }
            section_base_local = section_base_local + DStack_a8;
          }
          section_base_local = (Dwarf_Small *)local_size;
          pvVar2 = calloc((ulong)curformentry._7_1_,0x10);
          *(void **)(macro_header_local + 0x50) = pvVar2;
          macro_header_local[0x48] = curformentry._7_1_;
          if (*(long *)(macro_header_local + 0x50) == 0) {
            _dwarf_error((Dwarf_Debug)startptr,error,0x3e);
            macro_context_local._4_4_ = 1;
          }
          else {
            dbg = *(Dwarf_Debug *)(macro_header_local + 0x50);
            for (curformentry._0_4_ = 0; (uint)curformentry < curformentry._7_1_;
                curformentry._0_4_ = (uint)curformentry + 1) {
              formcount_1._3_1_ = 0;
              uStack_b8 = 0;
              readend_1._4_4_ = 0;
              _i = (Dwarf_Unsigned *)(section_base_local + (2 - section_size_local));
              if (table_size_out_local <= _i) {
                _dwarf_error((Dwarf_Debug)startptr,error,0x13e);
                return 1;
              }
              readend_1._3_1_ = 0;
              lu_leblen_1 = (Dwarf_Unsigned)(section_base_local + 1);
              if (lu_leblen_1 < section_base_local) {
                _dwarf_error_string((Dwarf_Debug)startptr,error,0x14b,
                                    "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                                   );
                return 1;
              }
              if (pDStack_80 < lu_leblen_1) {
                _dwarf_error_string((Dwarf_Debug)startptr,error,0x14b,
                                    "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                   );
                return 1;
              }
              (**(code **)(startptr + 0x1bf8))((long)&readend_1 + 3,section_base_local,1);
              formcount_1._3_1_ = readend_1._3_1_;
              section_base_local = section_base_local + 1;
              lu_local_1 = 0;
              uStack_d8 = 0;
              iVar1 = dwarf_decode_leb128((char *)section_base_local,&lu_local_1,
                                          &stack0xffffffffffffff28,(char *)pDStack_80);
              if (iVar1 == 1) {
                _dwarf_error_string((Dwarf_Debug)startptr,error,0x149,
                                    "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
                return 1;
              }
              uStack_b8 = uStack_d8;
              section_base_local = section_base_local + lu_local_1;
              *(byte *)&dbg->de_magic = formcount_1._3_1_;
              *(char *)((long)&dbg->de_magic + 1) = (char)uStack_d8;
              _i = (Dwarf_Unsigned *)((long)section_base_local + (uStack_d8 - section_size_local));
              if (table_size_out_local <= _i) {
                _dwarf_error((Dwarf_Debug)startptr,error,0x13e);
                return 1;
              }
              dbg->de_obj_file = (Dwarf_Obj_Access_Interface_a_s *)section_base_local;
              section_base_local =
                   (Dwarf_Small *)
                   ((long)&((Dwarf_Obj_Access_Interface_a_s *)section_base_local)->ai_object +
                   uStack_d8);
              if (0xc < formcount_1._3_1_) {
                for (local_de = 0; local_de < uStack_b8; local_de = local_de + 1) {
                  iVar1 = valid_macro_form((ushort)*(byte *)((long)&dbg->de_obj_file->ai_object +
                                                            (ulong)local_de));
                  if (iVar1 == 0) {
                    _dwarf_error((Dwarf_Debug)startptr,error,0x144);
                    return 1;
                  }
                }
              }
              iVar1 = validate_opcode(*(Dwarf_Debug *)(macro_header_local + 0xa8),
                                      (Dwarf_Macro_Forms_s *)dbg,error);
              if (iVar1 != 0) {
                return iVar1;
              }
              dbg = (Dwarf_Debug)&dbg->de_errhand;
            }
            *(Dwarf_Unsigned *)table_data_start = (long)section_base_local - local_size;
            macro_context_local._4_4_ = 0;
          }
        }
        else {
          _dwarf_error((Dwarf_Debug)startptr,error,0x13e);
          macro_context_local._4_4_ = 1;
        }
      }
    }
    else {
      _dwarf_error((Dwarf_Debug)startptr,error,0x13e);
      macro_context_local._4_4_ = 1;
    }
  }
  return macro_context_local._4_4_;
}

Assistant:

static int
read_operands_table(Dwarf_Macro_Context macro_context,
    Dwarf_Small * macro_header,
    Dwarf_Small * macro_data,
    Dwarf_Small * section_base,
    Dwarf_Unsigned section_size,
    Dwarf_Unsigned *table_size_out,
    Dwarf_Error *error)
{
    Dwarf_Small* table_data_start = macro_data;
    Dwarf_Unsigned local_size = 0;
    Dwarf_Unsigned cur_offset = 0;
    Dwarf_Small operand_table_count = 0;
    unsigned i = 0;
    struct Dwarf_Macro_Forms_s *curformentry = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Byte_Ptr startptr = 0;
    Dwarf_Byte_Ptr endptr = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    cur_offset = (1+ macro_data) - macro_header;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }

    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    READ_UNALIGNED_CK(dbg,operand_table_count,Dwarf_Small,
        macro_data,sizeof(Dwarf_Small),error,endptr);
    macro_data += sizeof(Dwarf_Small);
    /* Estimating minimum size */
    local_size = operand_table_count * 4;

    cur_offset = (local_size+ macro_data) - section_base;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }
    /* first, get size of table. */
    table_data_start = macro_data;
    for (i = 0; i < operand_table_count; ++i) {
        /*  Compiler warning about unused opcode_number
            variable should be ignored. */
        Dwarf_Unsigned formcount = 0;
#if 0   /* No need to actually read, just update pointer*/
        Dwarf_Small opcode_number = 0;
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),error,endptr);
#endif /*0*/
        macro_data += sizeof(Dwarf_Small);

        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);
        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        /* The 1 ubyte forms follow. Step past them. */
        macro_data += formcount;
    }
    /* reset for reread. */
    macro_data = table_data_start;
    /* allocate table */
    macro_context->mc_opcode_forms =  (struct Dwarf_Macro_Forms_s *)
        calloc(operand_table_count,
            sizeof(struct Dwarf_Macro_Forms_s));
    macro_context->mc_opcode_count = operand_table_count;
    if (!macro_context->mc_opcode_forms) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    curformentry = macro_context->mc_opcode_forms;
    for (i = 0; i < operand_table_count; ++i,++curformentry) {
        Dwarf_Small opcode_number = 0;
        Dwarf_Unsigned formcount = 0;
        int res = 0;

        cur_offset = (2 + macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),
            error,endptr);
        macro_data += sizeof(Dwarf_Small);
        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);

        curformentry->mf_code = opcode_number;
        curformentry->mf_formcount = (Dwarf_Small)formcount;

        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        curformentry->mf_formbytes = macro_data;
        macro_data += formcount;
        if (opcode_number  > DW_MACRO_undef_strx ) {
            Dwarf_Half k = 0;
            for (k = 0; k < formcount; ++k) {
                if (!valid_macro_form(
                    curformentry->mf_formbytes[k])) {
                    _dwarf_error(dbg, error,
                        DW_DLE_MACRO_OP_UNHANDLED);
                    return DW_DLV_ERROR;
                }
            }
        }
        res = validate_opcode(macro_context->mc_dbg,
            curformentry, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    *table_size_out = macro_data - table_data_start;
    return DW_DLV_OK;
}